

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache_ptr.cc
# Opt level: O2

void tcmalloc::SlowTLS::UnregisterEntry(Entry *entry)

{
  Entry *pEVar1;
  SpinLockHolder local_18;
  SpinLockHolder h;
  
  local_18.lock_ = &lock_;
  SpinLock::Lock(&lock_);
  pEVar1 = entry->next;
  *entry->prev = pEVar1;
  if (pEVar1 != (Entry *)0x0) {
    pEVar1->prev = entry->prev;
  }
  SpinLockHolder::~SpinLockHolder(&local_18);
  return;
}

Assistant:

static void UnregisterEntry(Entry* entry) {
    SpinLockHolder h(&lock_);
    ASSERT(*entry->prev == entry);
    Entry* next = *entry->prev = entry->next;
    if (next) {
      ASSERT(next->prev == &entry->next);
      next->prev = entry->prev;
    }
    entry->DebugDirty();
  }